

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void Curl_multi_process_pending_handles(Curl_multi *multi)

{
  Curl_easy *data;
  curl_llist_element *pcVar1;
  curl_llist_element *e;
  
  pcVar1 = multi->pending->head;
  while (e = pcVar1, e != (curl_llist_element *)0x0) {
    data = (Curl_easy *)e->ptr;
    pcVar1 = e->next;
    if (data->mstate == CURLM_STATE_CONNECT_PEND) {
      mstate(data,CURLM_STATE_CONNECT);
      Curl_llist_remove(multi->pending,e,(void *)0x0);
      Curl_expire_latest(data,0);
    }
  }
  return;
}

Assistant:

void Curl_multi_process_pending_handles(struct Curl_multi *multi)
{
  struct curl_llist_element *e = multi->pending->head;

  while(e) {
    struct Curl_easy *data = e->ptr;
    struct curl_llist_element *next = e->next;

    if(data->mstate == CURLM_STATE_CONNECT_PEND) {
      multistate(data, CURLM_STATE_CONNECT);

      /* Remove this node from the list */
      Curl_llist_remove(multi->pending, e, NULL);

      /* Make sure that the handle will be processed soonish. */
      Curl_expire_latest(data, 0);
    }

    e = next; /* operate on next handle */
  }
}